

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::SharedMemoryArbiterImpl::ReleaseWriterID(SharedMemoryArbiterImpl *this,WriterID id)

{
  lock_guard<std::mutex> lVar1;
  bool bVar2;
  anon_class_24_2_0bb5d836 local_a8;
  function<void_()> local_90;
  undefined1 local_70 [8];
  WeakPtr<perfetto::SharedMemoryArbiterImpl> weak_this;
  _Self local_48;
  _Self local_40;
  iterator it;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> scoped_lock;
  TaskRunner *task_runner;
  SharedMemoryArbiterImpl *pSStack_10;
  WriterID id_local;
  SharedMemoryArbiterImpl *this_local;
  
  scoped_lock._M_device = (mutex_type *)0x0;
  task_runner._6_2_ = id;
  pSStack_10 = this;
  ::std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)&this->lock_);
  IdAllocator<unsigned_short>::Free(&this->active_writer_ids_,task_runner._6_2_);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
       ::find(&this->pending_writers_,(key_type_conflict *)((long)&task_runner + 6));
  local_48._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
       ::end(&this->pending_writers_);
  bVar2 = std::operator!=(&local_40,&local_48);
  if (bVar2) {
    ::std::
    map<unsigned_short,unsigned_int,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_int>>>
    ::erase_abi_cxx11_((map<unsigned_short,unsigned_int,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_int>>>
                        *)&this->pending_writers_,(iterator)local_40._M_node);
    weak_this.handle_.
    super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 1;
  }
  else if (this->task_runner_ == (TaskRunner *)0x0) {
    weak_this.handle_.
    super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 1;
  }
  else {
    scoped_lock._M_device = (mutex_type *)this->task_runner_;
    weak_this.handle_.
    super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0;
  }
  ::std::lock_guard<std::mutex>::~lock_guard(&local_28);
  if (weak_this.handle_.
      super___shared_ptr<perfetto::SharedMemoryArbiterImpl_*,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ == 0) {
    perfetto::base::WeakPtrFactory<perfetto::SharedMemoryArbiterImpl>::GetWeakPtr
              ((WeakPtrFactory<perfetto::SharedMemoryArbiterImpl> *)local_70);
    lVar1 = scoped_lock;
    perfetto::base::WeakPtr<perfetto::SharedMemoryArbiterImpl>::WeakPtr
              (&local_a8.weak_this,(WeakPtr<perfetto::SharedMemoryArbiterImpl> *)local_70);
    local_a8.id = task_runner._6_2_;
    ::std::function<void()>::
    function<perfetto::SharedMemoryArbiterImpl::ReleaseWriterID(unsigned_short)::__0,void>
              ((function<void()> *)&local_90,&local_a8);
    (**(code **)(((lVar1._M_device)->super___mutex_base)._M_mutex.__align + 0x10))
              (lVar1._M_device,&local_90);
    ::std::function<void_()>::~function(&local_90);
    ReleaseWriterID(unsigned_short)::$_0::~__0((__0 *)&local_a8);
    perfetto::base::WeakPtr<perfetto::SharedMemoryArbiterImpl>::~WeakPtr
              ((WeakPtr<perfetto::SharedMemoryArbiterImpl> *)local_70);
  }
  return;
}

Assistant:

void SharedMemoryArbiterImpl::ReleaseWriterID(WriterID id) {
  base::TaskRunner* task_runner = nullptr;
  {
    std::lock_guard<std::mutex> scoped_lock(lock_);
    active_writer_ids_.Free(id);

    auto it = pending_writers_.find(id);
    if (it != pending_writers_.end()) {
      // Writer hasn't been bound yet and thus also not yet registered with the
      // service.
      pending_writers_.erase(it);
      return;
    }

    // A trace writer from an aborted session may be destroyed before the
    // arbiter is bound to a task runner. In that case, it was never registered
    // with the service.
    if (!task_runner_)
      return;

    task_runner = task_runner_;
  }  // scoped_lock

  // We shouldn't post tasks while locked. |task_runner| remains valid after
  // unlocking, because |task_runner_| is never reset.
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner->PostTask([weak_this, id] {
    if (weak_this)
      weak_this->producer_endpoint_->UnregisterTraceWriter(id);
  });
}